

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

Pla_Man_t * Pla_ManGenerate(int nInputs,int nOutputs,int nCubes,int fVerbose)

{
  ulong *puVar1;
  long lVar2;
  uint uVar3;
  int *piVar4;
  word *pwVar5;
  Pla_Man_t *pPVar6;
  Vec_Bit_t *pVVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  char Buffer [1000];
  char acStack_418 [1000];
  
  iVar15 = 0;
  sprintf(acStack_418,"%s_%d_%d_%d","rand",(ulong)(uint)nInputs);
  pPVar6 = Pla_ManAlloc(acStack_418,nInputs,nOutputs,nCubes);
  pVVar7 = Pla_GenRandom(nInputs,nCubes,0);
  uVar3 = pVVar7->nSize;
  if (0 < (int)uVar3) {
    piVar4 = pVVar7->pArray;
    iVar15 = 0;
    uVar10 = 0;
    do {
      uVar12 = (uint)uVar10;
      if (((uint)piVar4[uVar10 >> 5] >> (uVar12 & 0x1f) & 1) != 0) {
        uVar9 = pPVar6->nInWords * iVar15;
        if (((int)uVar9 < 0) || ((pPVar6->vInBits).nSize <= (int)uVar9)) goto LAB_0036fba8;
        iVar15 = iVar15 + 1;
        if (0 < nInputs) {
          pwVar5 = (pPVar6->vInBits).pArray;
          bVar13 = 0;
          uVar10 = 0;
          do {
            puVar1 = pwVar5 + (ulong)uVar9 + (uVar10 >> 5);
            *puVar1 = *puVar1 | (ulong)((uVar12 >> ((uint)uVar10 & 0x1f) & 1) != 0) + 1 <<
                                (bVar13 & 0x3e);
            uVar14 = (uint)uVar10 + 1;
            uVar10 = (ulong)uVar14;
            bVar13 = bVar13 + 2;
          } while (nInputs != uVar14);
        }
      }
      uVar10 = (ulong)(uVar12 + 1);
    } while (uVar12 + 1 != uVar3);
  }
  if (iVar15 != nCubes) {
    __assert_fail("Count == nCubes",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                  ,0xba,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
  }
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
    pVVar7->pArray = (int *)0x0;
  }
  if (pVVar7 != (Vec_Bit_t *)0x0) {
    free(pVVar7);
  }
  if (nOutputs < 2) {
    lVar8 = (long)(pPVar6->vCubes).nSize;
    if (0 < lVar8) {
      iVar15 = pPVar6->nOutWords;
      lVar11 = 0;
      do {
        if ((lVar11 < 0) ||
           (lVar2 = lVar11 + iVar15, (long)(pPVar6->vOutBits).nSize <= lVar2 - iVar15))
        goto LAB_0036fba8;
        puVar1 = (pPVar6->vOutBits).pArray + lVar11;
        *puVar1 = *puVar1 | 2;
        lVar8 = lVar8 + -1;
        lVar11 = lVar2;
      } while (lVar8 != 0);
    }
  }
  else {
    pVVar7 = Pla_GenRandom(nOutputs,nCubes,1);
    uVar3 = pVVar7->nSize;
    if ((int)uVar3 < 1) {
      iVar15 = 0;
    }
    else {
      piVar4 = pVVar7->pArray;
      iVar15 = 0;
      uVar12 = 0;
      do {
        if (((uint)piVar4[uVar12 >> 5] >> (uVar12 & 0x1f) & 1) != 0) {
          uVar9 = pPVar6->nOutWords * iVar15;
          if (((int)uVar9 < 0) || ((pPVar6->vOutBits).nSize <= (int)uVar9)) {
LAB_0036fba8:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          iVar15 = iVar15 + 1;
          pwVar5 = (pPVar6->vOutBits).pArray;
          bVar13 = 0;
          uVar10 = 0;
          do {
            puVar1 = pwVar5 + (ulong)uVar9 + (uVar10 >> 5);
            *puVar1 = *puVar1 | (ulong)((uVar12 >> ((uint)uVar10 & 0x1f) & 1) != 0) + 1 <<
                                (bVar13 & 0x3e);
            uVar14 = (uint)uVar10 + 1;
            uVar10 = (ulong)uVar14;
            bVar13 = bVar13 + 2;
          } while (nOutputs != uVar14);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar3);
    }
    if (iVar15 != nCubes) {
      __assert_fail("Count == nCubes",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaMan.c"
                    ,199,"Pla_Man_t *Pla_ManGenerate(int, int, int, int)");
    }
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pVVar7->pArray = (int *)0x0;
    }
    if (pVVar7 != (Vec_Bit_t *)0x0) {
      free(pVVar7);
    }
  }
  return pPVar6;
}

Assistant:

Pla_Man_t * Pla_ManGenerate( int nInputs, int nOutputs, int nCubes, int fVerbose )
{
    Pla_Man_t * p;
    Vec_Bit_t * vBits;
    int i, k, Count;
    word * pCube;
    char Buffer[1000];
    sprintf( Buffer, "%s_%d_%d_%d", "rand", nInputs, nOutputs, nCubes );
    p = Pla_ManAlloc( Buffer, nInputs, nOutputs, nCubes );
    // generate nCube random input minterms
    vBits = Pla_GenRandom( nInputs, nCubes, 0 );
    for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
        if ( Vec_BitEntry(vBits, i) )
        {
            pCube = Pla_CubeIn( p, Count++ );
            for ( k = 0; k < nInputs; k++ )
                Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
        }
    assert( Count == nCubes );
    Vec_BitFree( vBits );
    // generate nCube random output minterms
    if ( nOutputs > 1 )
    {
        vBits = Pla_GenRandom( nOutputs, nCubes, 1 );
        for ( i = Count = 0; i < Vec_BitSize(vBits); i++ )
            if ( Vec_BitEntry(vBits, i) )
            {
                pCube = Pla_CubeOut( p, Count++ );
                for ( k = 0; k < nOutputs; k++ )
                    Pla_CubeSetLit( pCube, k, ((i >> k) & 1) ? PLA_LIT_ONE : PLA_LIT_ZERO );
            }
        assert( Count == nCubes );
        Vec_BitFree( vBits );
    }
    else
    {
        Pla_ForEachCubeOut( p, pCube, i )
            Pla_CubeSetLit( pCube, 0, PLA_LIT_ONE );
    }
    return p;
}